

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O0

void glmc_rotate_at(vec4 *m,float *pivot,float angle,float *axis)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float *in_RDX;
  uint *in_RSI;
  undefined8 *in_RDI;
  float in_XMM0_Da;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  __m128 afVar3;
  __m128 a;
  __m128 a_00;
  __m128 a_01;
  __m128 a_02;
  __m128 a_03;
  __m128 a_04;
  __m128 a_05;
  __m128 a_06;
  __m128 a_07;
  __m128 a_08;
  __m128 a_09;
  __m128 b;
  __m128 b_00;
  __m128 b_01;
  __m128 b_02;
  __m128 b_03;
  __m128 b_04;
  __m128 b_05;
  __m128 b_06;
  __m128 b_07;
  __m128 b_08;
  __m128 b_09;
  __m128 b_10;
  __m128 c_00;
  __m128 c_01;
  __m128 c_02;
  __m128 c_03;
  __m128 c_04;
  __m128 c_05;
  __m128 c_06;
  __m128 c_07;
  __m128 c_08;
  __m128 c_09;
  __m128 c_10;
  __m128 c_11;
  vec3 pivotInv;
  __m128 m3_1;
  __m128 m2_1;
  __m128 m1_1;
  __m128 m0_1;
  __m128 m3;
  __m128 m2;
  __m128 m1;
  __m128 m0;
  mat4 rot;
  float c;
  vec3 vs;
  vec3 v;
  vec3 axisn;
  float norm;
  __m128 v2;
  __m128 v1;
  __m128 v0;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 l;
  uint local_668;
  uint local_664;
  uint local_660;
  float *local_658;
  float local_64c;
  undefined8 *local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  uint *local_5f8;
  undefined8 *local_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  float *local_558;
  float local_54c;
  undefined8 *local_548;
  float local_53c;
  float local_538;
  float local_534;
  float local_530;
  float local_528;
  float local_524;
  float local_520;
  float local_518;
  float local_514;
  float local_510;
  float *local_508;
  float local_4fc;
  float *local_4f8;
  undefined8 *local_4f0;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  undefined8 local_4b8;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  undefined8 *local_478;
  undefined8 *local_470;
  undefined8 *local_468;
  uint local_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint local_3fc;
  uint local_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint local_3e8;
  uint local_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint local_3bc;
  uint local_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint local_3a8;
  float local_3a4;
  float *local_3a0;
  float *local_398;
  float *local_390;
  float local_384;
  float *local_380;
  float *local_378;
  float local_36c;
  float *local_368;
  float *local_360;
  float local_354;
  float *local_350;
  float *local_348;
  float local_33c;
  float *local_338;
  float *local_330;
  float local_324;
  float *local_320;
  float *local_318;
  float local_30c;
  float *local_308;
  float *local_300;
  float *local_2f8;
  float *local_2f0;
  float *local_2e8;
  float *local_2e0;
  uint *local_2d8;
  undefined8 local_2c8;
  float fStack_2c0;
  float fStack_2bc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 uStack_44;
  float local_38;
  float local_28;
  float local_18;
  
  local_2d8 = &local_668;
  local_668 = *in_RSI ^ 0x80000000;
  local_664 = in_RSI[1] ^ 0x80000000;
  local_660 = in_RSI[2] ^ 0x80000000;
  uVar1 = *in_RDI;
  uStack_5b0 = in_RDI[1];
  local_468 = in_RDI + 2;
  uVar2 = *local_468;
  uStack_5c0 = in_RDI[3];
  local_470 = in_RDI + 4;
  local_5d8 = *local_470;
  uStack_5d0 = in_RDI[5];
  local_478 = in_RDI + 6;
  local_5e8 = *local_478;
  uStack_5e0 = in_RDI[7];
  local_3b8 = *in_RSI;
  a_00[3] = (float)local_3b8;
  a_00[2] = (float)local_3b8;
  local_3d8 = in_RSI[1];
  a[3] = (float)local_3d8;
  a[2] = (float)local_3d8;
  local_3f8 = in_RSI[2];
  afVar3[3] = (float)local_3f8;
  afVar3[2] = (float)local_3f8;
  afVar3[0] = (float)(int)local_5d8;
  afVar3[1] = (float)(int)((ulong)local_5d8 >> 0x20);
  b._8_8_ = in_XMM3_Qa;
  b[0] = (float)(int)local_5e8;
  b[1] = (float)(int)((ulong)local_5e8 >> 0x20);
  c_00._8_8_ = in_XMM5_Qa;
  c_00._0_8_ = in_XMM4_Qa;
  local_658 = in_RDX;
  local_64c = in_XMM0_Da;
  local_640 = in_RDI;
  local_5c8 = uVar2;
  local_5b8 = uVar1;
  uStack_3f4 = local_3f8;
  uStack_3f0 = local_3f8;
  uStack_3ec = local_3f8;
  local_3e8 = local_3f8;
  uStack_3d4 = local_3d8;
  uStack_3d0 = local_3d8;
  uStack_3cc = local_3d8;
  local_3bc = local_3d8;
  uStack_3b4 = local_3b8;
  uStack_3b0 = local_3b8;
  uStack_3ac = local_3b8;
  local_3a8 = local_3b8;
  afVar3 = glmm_fmadd(afVar3,b,c_00);
  a[0] = (float)(int)uVar2;
  a[1] = (float)(int)((ulong)uVar2 >> 0x20);
  b_00[2] = (float)(int)in_XMM3_Qa;
  b_00[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_00[0] = (float)(int)afVar3._0_8_;
  b_00[1] = (float)(int)((ulong)afVar3._0_8_ >> 0x20);
  c_01[2] = (float)(int)in_XMM5_Qa;
  c_01[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_01[0] = (float)(int)in_XMM4_Qa;
  c_01[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  afVar3 = glmm_fmadd(a,b_00,c_01);
  a_00[0] = (float)(int)uVar1;
  a_00[1] = (float)(int)((ulong)uVar1 >> 0x20);
  b_01[2] = (float)(int)in_XMM3_Qa;
  b_01[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_01[0] = (float)(int)afVar3._0_8_;
  b_01[1] = (float)(int)((ulong)afVar3._0_8_ >> 0x20);
  c_02[2] = (float)(int)in_XMM5_Qa;
  c_02[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_02[0] = (float)(int)in_XMM4_Qa;
  c_02[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  afVar3 = glmm_fmadd(a_00,b_01,c_02);
  local_4b8 = afVar3._0_8_;
  in_RDI[6] = local_4b8;
  in_RDI[7] = extraout_XMM0_Qb;
  local_548 = local_640;
  local_54c = local_64c;
  local_558 = local_658;
  local_4f8 = (float *)&local_598;
  local_4fc = local_64c;
  local_508 = local_658;
  local_4a0 = in_RDI + 6;
  local_53c = cosf(local_64c);
  local_398 = local_508;
  local_3a0 = &local_518;
  local_300 = local_508;
  local_2f0 = local_508;
  local_2e0 = local_508;
  local_2e8 = local_508;
  local_3a4 = sqrtf(local_508[2] * local_508[2] +
                    *local_508 * *local_508 + local_508[1] * local_508[1]);
  if (local_3a4 < 1.1920929e-07) {
    local_2f8 = local_3a0;
    local_3a0[2] = 0.0;
    local_2f8[1] = 0.0;
    *local_2f8 = 0.0;
  }
  else {
    local_384 = 1.0 / local_3a4;
    local_380 = local_398;
    local_390 = local_3a0;
    *local_3a0 = *local_398 * local_384;
    local_390[1] = local_380[1] * local_384;
    local_390[2] = local_380[2] * local_384;
  }
  local_30c = 1.0 - local_53c;
  local_318 = &local_528;
  local_528 = local_518 * local_30c;
  local_524 = local_514 * local_30c;
  local_520 = local_510 * local_30c;
  local_308 = &local_518;
  local_324 = sinf(local_4fc);
  local_330 = &local_538;
  local_538 = local_518 * local_324;
  local_534 = local_514 * local_324;
  local_530 = local_510 * local_324;
  local_33c = local_528;
  local_348 = local_4f8;
  local_338 = &local_518;
  local_320 = &local_518;
  *local_4f8 = local_518 * local_528;
  local_348[1] = local_338[1] * local_33c;
  local_348[2] = local_338[2] * local_33c;
  local_360 = local_4f8 + 4;
  local_354 = local_524;
  local_350 = &local_518;
  *local_360 = local_518 * local_524;
  local_360[1] = local_350[1] * local_354;
  local_360[2] = local_350[2] * local_354;
  local_378 = local_4f8 + 8;
  local_36c = local_520;
  local_368 = &local_518;
  *local_378 = local_518 * local_520;
  local_378[1] = local_368[1] * local_36c;
  local_378[2] = local_368[2] * local_36c;
  *local_4f8 = *local_4f8 + local_53c;
  local_4f8[4] = local_4f8[4] - local_530;
  local_4f8[8] = local_4f8[8] + local_534;
  local_4f8[1] = local_4f8[1] + local_530;
  local_4f8[5] = local_4f8[5] + local_53c;
  local_4f8[9] = local_4f8[9] - local_538;
  local_4f8[2] = local_4f8[2] - local_534;
  local_4f8[6] = local_4f8[6] + local_538;
  local_4f8[10] = local_4f8[10] + local_53c;
  local_4f8[0xe] = 0.0;
  local_4f8[0xd] = 0.0;
  local_4f8[0xc] = 0.0;
  local_4f8[0xb] = 0.0;
  local_4f8[7] = 0.0;
  local_4f8[3] = 0.0;
  local_4f8[0xf] = 1.0;
  local_4e0 = local_548;
  local_4e8 = &local_598;
  local_4f0 = local_548;
  local_240 = local_548;
  local_250 = local_548;
  local_190 = local_548;
  local_188 = *local_548;
  uStack_180 = local_548[1];
  local_278 = local_598;
  uStack_270 = uStack_590;
  local_1a0 = &local_588;
  local_288 = local_588;
  uStack_280 = uStack_580;
  local_1a8 = &local_578;
  local_298 = local_578;
  uStack_290 = uStack_570;
  local_18 = (float)local_598;
  local_a8 = local_18;
  fStack_a4 = local_18;
  fStack_a0 = local_18;
  fStack_9c = local_18;
  local_138 = CONCAT44(local_18,local_18);
  uStack_130 = CONCAT44(local_18,local_18);
  local_148._0_4_ = (float)local_188;
  local_148._4_4_ = (float)((ulong)local_188 >> 0x20);
  uStack_140._0_4_ = (float)uStack_180;
  uStack_140._4_4_ = (float)((ulong)uStack_180 >> 0x20);
  local_2a8 = CONCAT44(local_18 * local_148._4_4_,local_18 * (float)local_148);
  uStack_2a0 = CONCAT44(local_18 * uStack_140._4_4_,local_18 * (float)uStack_140);
  local_28 = (float)local_588;
  local_b8 = local_28;
  fStack_b4 = local_28;
  fStack_b0 = local_28;
  fStack_ac = local_28;
  local_158 = CONCAT44(local_28,local_28);
  uStack_150 = CONCAT44(local_28,local_28);
  local_2b8 = CONCAT44(local_28 * local_148._4_4_,local_28 * (float)local_148);
  uStack_2b0 = CONCAT44(local_28 * uStack_140._4_4_,local_28 * (float)uStack_140);
  local_38 = (float)local_578;
  local_c8 = local_38;
  fStack_c4 = local_38;
  fStack_c0 = local_38;
  fStack_bc = local_38;
  local_178 = CONCAT44(local_38,local_38);
  uStack_170 = CONCAT44(local_38,local_38);
  local_2c8 = CONCAT44(local_38 * local_148._4_4_,local_38 * (float)local_148);
  _fStack_2c0 = CONCAT44(local_38 * uStack_140._4_4_,local_38 * (float)uStack_140);
  local_1b0 = local_548 + 2;
  local_268 = *local_1b0;
  uStack_260 = local_548[3];
  uStack_44 = (undefined4)((ulong)local_598 >> 0x20);
  local_d8 = uStack_44;
  uStack_d4 = uStack_44;
  uStack_d0 = uStack_44;
  uStack_cc = uStack_44;
  a_01[1] = (float)uStack_44;
  a_01[0] = (float)uStack_44;
  a_01[2] = (float)(int)local_268;
  a_01[3] = (float)(int)((ulong)local_268 >> 0x20);
  b_02[2] = (float)(int)in_XMM3_Qa;
  b_02[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_02[0] = local_18 * (float)local_148;
  b_02[1] = local_18 * local_148._4_4_;
  c_03[2] = (float)(int)in_XMM5_Qa;
  c_03[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_03[0] = (float)(int)in_XMM4_Qa;
  c_03[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  local_248 = local_4e8;
  local_198 = local_4e8;
  local_168 = local_188;
  uStack_160 = uStack_180;
  local_148 = local_188;
  uStack_140 = uStack_180;
  afVar3 = glmm_fmadd(a_01,b_02,c_03);
  local_2a8 = afVar3._0_8_;
  local_58 = local_288;
  uVar1 = local_58;
  uStack_50 = uStack_280;
  local_58._4_4_ = (undefined4)((ulong)local_288 >> 0x20);
  local_e8 = local_58._4_4_;
  uStack_e4 = local_58._4_4_;
  uStack_e0 = local_58._4_4_;
  uStack_dc = local_58._4_4_;
  a_02[1] = (float)local_58._4_4_;
  a_02[0] = (float)local_58._4_4_;
  a_02[2] = (float)(undefined4)local_268;
  a_02[3] = (float)local_268._4_4_;
  b_03[2] = (float)(int)in_XMM3_Qa;
  b_03[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_03[0] = (float)(undefined4)local_2b8;
  b_03[1] = (float)local_2b8._4_4_;
  c_04[2] = (float)(int)in_XMM5_Qa;
  c_04[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_04[0] = (float)(int)in_XMM4_Qa;
  c_04[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  local_58 = uVar1;
  afVar3 = glmm_fmadd(a_02,b_03,c_04);
  local_2b8 = afVar3._0_8_;
  local_68 = local_298;
  uVar1 = local_68;
  uStack_60 = uStack_290;
  local_68._4_4_ = (undefined4)((ulong)local_298 >> 0x20);
  local_f8 = local_68._4_4_;
  uStack_f4 = local_68._4_4_;
  uStack_f0 = local_68._4_4_;
  uStack_ec = local_68._4_4_;
  a_03[1] = (float)local_68._4_4_;
  a_03[0] = (float)local_68._4_4_;
  a_03[2] = (float)(undefined4)local_268;
  a_03[3] = (float)local_268._4_4_;
  b_04[2] = (float)(int)in_XMM3_Qa;
  b_04[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_04[0] = (float)(undefined4)local_2c8;
  b_04[1] = (float)local_2c8._4_4_;
  c_05[2] = (float)(int)in_XMM5_Qa;
  c_05[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_05[0] = (float)(int)in_XMM4_Qa;
  c_05[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  local_68 = uVar1;
  afVar3 = glmm_fmadd(a_03,b_04,c_05);
  local_2c8 = afVar3._0_8_;
  local_1b8 = local_240 + 4;
  local_268 = *local_1b8;
  uStack_260 = local_240[5];
  local_78 = local_278;
  uStack_70 = uStack_270;
  uVar1 = uStack_70;
  uStack_70._0_4_ = (undefined4)uStack_270;
  local_108 = (undefined4)uStack_70;
  uStack_104 = (undefined4)uStack_70;
  uStack_100 = (undefined4)uStack_70;
  uStack_fc = (undefined4)uStack_70;
  a_04[1] = (float)(undefined4)uStack_70;
  a_04[0] = (float)(undefined4)uStack_70;
  a_04[2] = (float)(int)local_268;
  a_04[3] = (float)(int)((ulong)local_268 >> 0x20);
  b_05[2] = (float)(int)in_XMM3_Qa;
  b_05[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_05[0] = (float)(undefined4)local_2a8;
  b_05[1] = (float)local_2a8._4_4_;
  c_06[2] = (float)(int)in_XMM5_Qa;
  c_06[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_06[0] = (float)(int)in_XMM4_Qa;
  c_06[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  uStack_70 = uVar1;
  afVar3 = glmm_fmadd(a_04,b_05,c_06);
  local_2a8 = afVar3._0_8_;
  local_88 = local_288;
  uStack_80 = uStack_280;
  uVar1 = uStack_80;
  uStack_80._0_4_ = (undefined4)uStack_280;
  local_118 = (undefined4)uStack_80;
  uStack_114 = (undefined4)uStack_80;
  uStack_110 = (undefined4)uStack_80;
  uStack_10c = (undefined4)uStack_80;
  a_05[1] = (float)(undefined4)uStack_80;
  a_05[0] = (float)(undefined4)uStack_80;
  a_05[2] = (float)(undefined4)local_268;
  a_05[3] = (float)local_268._4_4_;
  b_06[2] = (float)(int)in_XMM3_Qa;
  b_06[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_06[0] = (float)(undefined4)local_2b8;
  b_06[1] = (float)local_2b8._4_4_;
  c_07[2] = (float)(int)in_XMM5_Qa;
  c_07[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_07[0] = (float)(int)in_XMM4_Qa;
  c_07[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  uStack_2a0 = extraout_XMM0_Qb_00;
  uStack_80 = uVar1;
  afVar3 = glmm_fmadd(a_05,b_06,c_07);
  local_2b8 = afVar3._0_8_;
  local_98 = local_298;
  uStack_90 = uStack_290;
  uVar1 = uStack_90;
  uStack_90._0_4_ = (undefined4)uStack_290;
  local_128 = (undefined4)uStack_90;
  uStack_124 = (undefined4)uStack_90;
  uStack_120 = (undefined4)uStack_90;
  uStack_11c = (undefined4)uStack_90;
  a_06[1] = (float)(undefined4)uStack_90;
  a_06[0] = (float)(undefined4)uStack_90;
  a_06[2] = (float)(undefined4)local_268;
  a_06[3] = (float)local_268._4_4_;
  b_07[2] = (float)(int)in_XMM3_Qa;
  b_07[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_07[0] = (float)(undefined4)local_2c8;
  b_07[1] = (float)local_2c8._4_4_;
  c_08[2] = (float)(int)in_XMM5_Qa;
  c_08[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_08[0] = (float)(int)in_XMM4_Qa;
  c_08[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  uStack_2b0 = extraout_XMM0_Qb_01;
  uStack_90 = uVar1;
  afVar3 = glmm_fmadd(a_06,b_07,c_08);
  local_2c8 = afVar3._0_8_;
  local_1c8 = local_250;
  local_1d8 = local_2a8;
  uStack_1d0 = uStack_2a0;
  *local_250 = local_2a8;
  local_250[1] = uStack_2a0;
  local_1e0 = local_250 + 2;
  local_1f8 = local_2b8;
  uStack_1f0 = uStack_2b0;
  *local_1e0 = local_2b8;
  local_250[3] = uStack_2b0;
  local_200 = local_250 + 4;
  *local_200 = local_2c8;
  local_250[5] = extraout_XMM0_Qb_02;
  local_220 = local_250 + 6;
  local_1c0 = local_240 + 6;
  local_238 = *local_1c0;
  uStack_230 = local_240[7];
  *local_220 = local_238;
  local_250[7] = uStack_230;
  local_5f0 = local_640;
  local_5f8 = &local_668;
  local_480 = local_640;
  uVar1 = *local_640;
  uStack_600 = local_640[1];
  local_488 = local_640 + 2;
  uVar2 = *local_488;
  uStack_610 = local_640[3];
  local_490 = local_640 + 4;
  local_628 = *local_490;
  uStack_620 = local_640[5];
  local_498 = local_640 + 6;
  local_638 = *local_498;
  uStack_630 = local_640[7];
  local_418 = local_668;
  a_09[3] = (float)local_668;
  a_09[2] = (float)local_668;
  a_08[3] = (float)local_664;
  a_08[2] = (float)local_664;
  a_07[3] = (float)local_660;
  a_07[2] = (float)local_660;
  a_07[0] = (float)(int)local_628;
  a_07[1] = (float)(int)((ulong)local_628 >> 0x20);
  b_08[2] = (float)(int)in_XMM3_Qa;
  b_08[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_08[0] = (float)(int)local_638;
  b_08[1] = (float)(int)((ulong)local_638 >> 0x20);
  c_09[2] = (float)(int)in_XMM5_Qa;
  c_09[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_09[0] = (float)(int)in_XMM4_Qa;
  c_09[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  local_618 = uVar2;
  local_608 = uVar1;
  uStack_414 = local_418;
  uStack_410 = local_418;
  uStack_40c = local_418;
  local_3fc = local_418;
  local_218 = local_2c8;
  afVar3 = glmm_fmadd(a_07,b_08,c_09);
  a_08[0] = (float)(int)uVar2;
  a_08[1] = (float)(int)((ulong)uVar2 >> 0x20);
  b_09[2] = (float)(int)in_XMM3_Qa;
  b_09[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_09[0] = (float)(int)afVar3._0_8_;
  b_09[1] = (float)(int)((ulong)afVar3._0_8_ >> 0x20);
  c_10[2] = (float)(int)in_XMM5_Qa;
  c_10[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_10[0] = (float)(int)in_XMM4_Qa;
  c_10[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  afVar3 = glmm_fmadd(a_08,b_09,c_10);
  a_09[0] = (float)(int)uVar1;
  a_09[1] = (float)(int)((ulong)uVar1 >> 0x20);
  b_10[2] = (float)(int)in_XMM3_Qa;
  b_10[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_10[0] = (float)(int)afVar3._0_8_;
  b_10[1] = (float)(int)((ulong)afVar3._0_8_ >> 0x20);
  c_11[2] = (float)(int)in_XMM5_Qa;
  c_11[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_11[0] = (float)(int)in_XMM4_Qa;
  c_11[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  afVar3 = glmm_fmadd(a_09,b_10,c_11);
  local_640[6] = afVar3._0_8_;
  local_640[7] = extraout_XMM0_Qb_03;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotate_at(mat4 m, vec3 pivot, float angle, vec3 axis) {
  glm_rotate_at(m, pivot, angle, axis);
}